

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  SelectionVector *pSVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  idx_t local_68;
  idx_t local_58;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        local_68 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        local_68 = 0;
        uVar9 = 0;
        do {
          uVar8 = uVar9;
          if (psVar1 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar1[uVar9];
          }
          uVar4 = uVar9;
          if (psVar2 != (sel_t *)0x0) {
            uVar4 = (ulong)psVar2[uVar9];
          }
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          if (((ldata[uVar4].months != rdata[uVar6].months) ||
              (ldata[uVar4].days != rdata[uVar6].days)) ||
             (ldata[uVar4].micros != rdata[uVar6].micros)) {
            lVar10 = (long)ldata[uVar4].days + ldata[uVar4].micros / 86400000000;
            lVar11 = (long)rdata[uVar6].days + rdata[uVar6].micros / 86400000000;
            if ((((long)ldata[uVar4].months + lVar10 / 0x1e !=
                  (long)rdata[uVar6].months + lVar11 / 0x1e) || (lVar10 % 0x1e != lVar11 % 0x1e)) ||
               (ldata[uVar4].micros % 86400000000 != rdata[uVar6].micros % 86400000000)) {
              false_sel->sel_vector[local_68] = (sel_t)uVar8;
              local_68 = local_68 + 1;
            }
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
      return count - local_68;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      local_68 = 0;
      uVar9 = 0;
      do {
        uVar8 = uVar9;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar9];
        }
        uVar4 = uVar9;
        if (psVar2 != (sel_t *)0x0) {
          uVar4 = (ulong)psVar2[uVar9];
        }
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        if (((ldata[uVar4].months == rdata[uVar6].months) &&
            (ldata[uVar4].days == rdata[uVar6].days)) &&
           (ldata[uVar4].micros == rdata[uVar6].micros)) {
LAB_00ef31f8:
          true_sel->sel_vector[local_68] = (sel_t)uVar8;
          local_68 = local_68 + 1;
        }
        else {
          lVar10 = (long)ldata[uVar4].days + ldata[uVar4].micros / 86400000000;
          lVar11 = (long)rdata[uVar6].days + rdata[uVar6].micros / 86400000000;
          if ((((long)ldata[uVar4].months + lVar10 / 0x1e ==
                (long)rdata[uVar6].months + lVar11 / 0x1e) && (lVar10 % 0x1e == lVar11 % 0x1e)) &&
             (ldata[uVar4].micros % 86400000000 == rdata[uVar6].micros % 86400000000))
          goto LAB_00ef31f8;
        }
        uVar9 = uVar9 + 1;
        if (count == uVar9) {
          return local_68;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_68 = 0;
    local_58 = 0;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar9];
      }
      uVar4 = uVar9;
      if (psVar2 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar2[uVar9];
      }
      uVar6 = uVar9;
      if (psVar3 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar3[uVar9];
      }
      if (((ldata[uVar4].months == rdata[uVar6].months) && (ldata[uVar4].days == rdata[uVar6].days))
         && (ldata[uVar4].micros == rdata[uVar6].micros)) {
LAB_00ef302f:
        iVar5 = local_68;
        pSVar7 = true_sel;
        local_68 = local_68 + 1;
      }
      else {
        lVar10 = (long)ldata[uVar4].days + ldata[uVar4].micros / 86400000000;
        lVar11 = (long)rdata[uVar6].days + rdata[uVar6].micros / 86400000000;
        if ((((long)ldata[uVar4].months + lVar10 / 0x1e == (long)rdata[uVar6].months + lVar11 / 0x1e
             ) && (lVar10 % 0x1e == lVar11 % 0x1e)) &&
           (ldata[uVar4].micros % 86400000000 == rdata[uVar6].micros % 86400000000))
        goto LAB_00ef302f;
        iVar5 = local_58;
        pSVar7 = false_sel;
        local_58 = local_58 + 1;
      }
      pSVar7->sel_vector[iVar5] = (sel_t)uVar8;
      uVar9 = uVar9 + 1;
      if (count == uVar9) {
        return local_68;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}